

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TlsReceiverTest::TlsReceiverTest(TlsReceiverTest *this)

{
  RefOrVoid<kj::AsyncIoProvider> params;
  MockConnectionReceiver *pMVar1;
  Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t> *other;
  Own<kj::ConnectionReceiver,_std::nullptr_t> local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t> baseReceiverPtr;
  Options local_120;
  Options local_98;
  undefined8 local_10;
  TlsReceiverTest *this_local;
  
  local_10 = this;
  TlsTest::defaultClient();
  TlsTest::defaultServer();
  TlsTest::TlsTest(&this->super_TlsTest,&local_98,&local_120);
  TlsContext::Options::~Options(&local_120);
  TlsContext::Options::~Options(&local_98);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::Own(&this->receiver);
  params = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator*(&(this->super_TlsTest).io.provider);
  heap<kj::(anonymous_namespace)::MockConnectionReceiver,kj::AsyncIoProvider&>
            ((kj *)local_140,params);
  pMVar1 = Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t>::get
                     ((Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t> *)
                      local_140);
  this->baseReceiver = pMVar1;
  other = mv<kj::Own<kj::(anonymous_namespace)::MockConnectionReceiver,decltype(nullptr)>>
                    ((Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t> *)
                     local_140);
  Own<kj::ConnectionReceiver,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::MockConnectionReceiver,void>
            ((Own<kj::ConnectionReceiver,decltype(nullptr)> *)&local_160,other);
  TlsContext::wrapPort
            ((TlsContext *)local_150,
             (Own<kj::ConnectionReceiver,_std::nullptr_t> *)&(this->super_TlsTest).tlsServer);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::operator=
            (&this->receiver,(Own<kj::ConnectionReceiver,_std::nullptr_t> *)local_150);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)local_150);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::~Own(&local_160);
  Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t> *)local_140);
  return;
}

Assistant:

TlsReceiverTest(): TlsTest() {
    auto baseReceiverPtr = kj::heap<MockConnectionReceiver>(*io.provider);
    baseReceiver = baseReceiverPtr.get();
    receiver = tlsServer.wrapPort(kj::mv(baseReceiverPtr));
  }